

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string * __thiscall
google::protobuf::Reflection::GetRepeatedStringReference
          (Reflection *this,Message *message,FieldDescriptor *field,int index,string *scratch)

{
  bool bVar1;
  CppStringType CVar2;
  uint32_t uVar3;
  Cord *src;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *description;
  Descriptor *pDVar6;
  Metadata MVar7;
  
  MVar7 = Message::GetMetadata(message);
  if (MVar7.reflection != this) {
    pDVar6 = this->descriptor_;
    MVar7 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar6,MVar7.descriptor,field,"GetRepeatedStringReference");
  }
  pDVar6 = this->descriptor_;
  if (field->containing_type_ == pDVar6) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"GetRepeatedStringReference",CPPTYPE_STRING);
      }
      if ((field->field_0x1 & 8) == 0) {
        CVar2 = FieldDescriptor::cpp_string_type(field);
        if ((CVar2 != kView) && (CVar2 != kString)) {
          if (CVar2 == kCord) {
            src = GetRepeatedField<absl::lts_20250127::Cord>(this,message,field,index);
            absl::lts_20250127::CopyCordToString(src,scratch);
            return scratch;
          }
          internal::Unreachable
                    ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x88c);
        }
        pbVar5 = GetRepeatedPtrField<std::__cxx11::string>(this,message,field,index);
        return pbVar5;
      }
      uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      psVar4 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                         ((ExtensionSet *)
                          ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                          field->number_,index);
      return psVar4;
    }
    pDVar6 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar6,field,"GetRepeatedStringReference",description);
}

Assistant:

const std::string& Reflection::GetRepeatedStringReference(
    const Message& message, const FieldDescriptor* field, int index,
    std::string* scratch) const {
  (void)scratch;  // Parameter is used by Google-internal code.
  USAGE_CHECK_ALL(GetRepeatedStringReference, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        absl::CopyCordToString(
            GetRepeatedField<absl::Cord>(message, field, index), scratch);
        return *scratch;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        return GetRepeatedPtrField<std::string>(message, field, index);
    }
    internal::Unreachable();
  }
}